

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O3

void __thiscall AST::ASTBuilder::removeSelfIfOnlyHasOneChild(ASTBuilder *this)

{
  iterator *piVar1;
  _Map_pointer pppAVar2;
  _Elt_pointer ppAVar3;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar4;
  reference ppAVar5;
  ASTNode *this_00;
  value_type B;
  ASTNode *local_20;
  
  ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar3 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this_00 = ppAVar3[-1];
  local_20 = this_00;
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&(this->stack).c);
  pdVar4 = ASTNode::getChildren(this_00);
  pppAVar2 = (pdVar4->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_node;
  if (((long)(pdVar4->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last -
       (long)(pdVar4->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)(pdVar4->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(pdVar4->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)pppAVar2 -
                (long)(pdVar4->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(pppAVar2 == (_Map_pointer)0x0)) * 0x40 == 1) {
    pdVar4 = ASTNode::getChildren(this_00);
    ppAVar5 = std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::at(pdVar4,0);
    this_00 = *ppAVar5;
    local_20 = this_00;
  }
  ppAVar3 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar3 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<AST::ASTNode*,std::allocator<AST::ASTNode*>>::_M_push_back_aux<AST::ASTNode*const&>
              ((deque<AST::ASTNode*,std::allocator<AST::ASTNode*>> *)&this->stack,&local_20);
  }
  else {
    *ppAVar3 = this_00;
    piVar1 = &(this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void AST::ASTBuilder::removeSelfIfOnlyHasOneChild() {
    auto B = stack.top();
    stack.pop();
    if (B->getChildren().size() == 1) B = B->getChildren().at(0);
    stack.push(B);
}